

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav *pWav,ma_uint64 framesToRead,ma_int16 *pBufferOut)

{
  long in_RDX;
  void *in_RSI;
  ma_uint64 in_RDI;
  ma_int16 *in_stack_00000048;
  ma_uint64 in_stack_00000050;
  ma_dr_wav *in_stack_00000058;
  ma_int16 *in_stack_00000068;
  ma_uint64 in_stack_00000070;
  ma_dr_wav *in_stack_00000078;
  ma_int16 *in_stack_00001008;
  ma_uint64 in_stack_00001010;
  ma_dr_wav *in_stack_00001018;
  ma_dr_wav *in_stack_fffffffffffffff8;
  ma_uint64 mVar1;
  
  if ((in_RDI == 0) || (in_RSI == (void *)0x0)) {
    mVar1 = 0;
  }
  else if (in_RDX == 0) {
    mVar1 = ma_dr_wav_read_pcm_frames(in_stack_fffffffffffffff8,in_RDI,in_RSI);
  }
  else if (*(short *)(in_RDI + 0x74) == 1) {
    mVar1 = ma_dr_wav_read_pcm_frames_s16__pcm
                      (in_stack_00001018,in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 3) {
    mVar1 = ma_dr_wav_read_pcm_frames_s16__ieee
                      (in_stack_00001018,in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 6) {
    mVar1 = ma_dr_wav_read_pcm_frames_s16__alaw
                      (in_stack_00001018,in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 7) {
    mVar1 = ma_dr_wav_read_pcm_frames_s16__mulaw
                      (in_stack_00001018,in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 2) {
    mVar1 = ma_dr_wav_read_pcm_frames_s16__msadpcm
                      (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  }
  else if (*(short *)(in_RDI + 0x74) == 0x11) {
    mVar1 = ma_dr_wav_read_pcm_frames_s16__ima
                      (in_stack_00000078,in_stack_00000070,in_stack_00000068);
  }
  else {
    mVar1 = 0;
  }
  return mVar1;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_s16(ma_dr_wav* pWav, ma_uint64 framesToRead, ma_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_wav_read_pcm_frames(pWav, framesToRead, NULL);
    }
    if (framesToRead * pWav->channels * sizeof(ma_int16) > MA_SIZE_MAX) {
        framesToRead = MA_SIZE_MAX / sizeof(ma_int16) / pWav->channels;
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_PCM) {
        return ma_dr_wav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_IEEE_FLOAT) {
        return ma_dr_wav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ALAW) {
        return ma_dr_wav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_MULAW) {
        return ma_dr_wav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }
    if (pWav->translatedFormatTag == MA_DR_WAVE_FORMAT_DVI_ADPCM) {
        return ma_dr_wav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }
    return 0;
}